

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall cmGeneratorTarget::ImportedGetLocation(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string local_38;
  string *local_18;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_18 = config;
  config_local = (string *)this;
  if (ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&ImportedGetLocation(std::__cxx11::string_const&)::
                                 location_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_);
    }
  }
  bVar1 = IsImported(this);
  if (!bVar1) {
    __assert_fail("this->IsImported()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xd90,
                  "const char *cmGeneratorTarget::ImportedGetLocation(const std::string &) const");
  }
  cmTarget::ImportedGetFullPath(&local_38,this->Target,local_18,false);
  std::__cxx11::string::operator=
            ((string *)&ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
             (string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  return pcVar3;
}

Assistant:

const char*
cmGeneratorTarget::ImportedGetLocation(const std::string& config) const
{
  static std::string location;
  assert(this->IsImported());
  location = this->Target->ImportedGetFullPath(config, false);
  return location.c_str();
}